

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O0

void __thiscall CipherTest_CAVP_AES_192_CBC_Test::TestBody(CipherTest_CAVP_AES_192_CBC_Test *this)

{
  function<void_(FileTest_*)> local_30;
  CipherTest_CAVP_AES_192_CBC_Test *local_10;
  CipherTest_CAVP_AES_192_CBC_Test *this_local;
  
  local_10 = this;
  std::function<void(FileTest*)>::function<void(&)(FileTest*),void>
            ((function<void(FileTest*)> *)&local_30,CipherFileTest);
  FileTestGTest("crypto/cipher/test/nist_cavp/aes_192_cbc.txt",&local_30);
  std::function<void_(FileTest_*)>::~function(&local_30);
  return;
}

Assistant:

TEST(CipherTest, CAVP_AES_192_CBC) {
  FileTestGTest("crypto/cipher/test/nist_cavp/aes_192_cbc.txt", CipherFileTest);
}